

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O3

Amap_Lib_t * Amap_LibReadFile(char *pFileName,int fVerbose)

{
  char *pBuffer;
  Amap_Lib_t *pAVar1;
  size_t sVar2;
  char *__dest;
  
  pBuffer = Amap_LoadFile(pFileName);
  if (pBuffer == (char *)0x0) {
    pAVar1 = (Amap_Lib_t *)0x0;
  }
  else {
    pAVar1 = Amap_LibReadBuffer(pBuffer,fVerbose);
    if (pAVar1 != (Amap_Lib_t *)0x0) {
      if (pFileName == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar2 = strlen(pFileName);
        __dest = (char *)malloc(sVar2 + 1);
        strcpy(__dest,pFileName);
      }
      pAVar1->pName = __dest;
    }
    free(pBuffer);
  }
  return pAVar1;
}

Assistant:

Amap_Lib_t * Amap_LibReadFile( char * pFileName, int fVerbose )
{
    Amap_Lib_t * pLib;
    char * pBuffer;
    pBuffer = Amap_LoadFile( pFileName );
    if ( pBuffer == NULL )
        return NULL;
    pLib = Amap_LibReadBuffer( pBuffer, fVerbose );
    if ( pLib )
        pLib->pName = Abc_UtilStrsav( pFileName );
    ABC_FREE( pBuffer );
    return pLib;
}